

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

int lua_cjson_safe_new(lua_State *l)

{
  int local_2c;
  char *pcStack_28;
  int i;
  char *func [3];
  lua_State *l_local;
  
  pcStack_28 = "decode";
  func[0] = "encode";
  func[1] = (char *)0x0;
  func[2] = (char *)l;
  lua_cjson_new(l);
  lua_pushcclosure((lua_State *)func[2],lua_cjson_safe_new,0);
  lua_setfield((lua_State *)func[2],-2,"new");
  local_2c = 0;
  while (*(long *)((long)&stack0xffffffffffffffd8 + (long)local_2c * 8) != 0) {
    lua_getfield((lua_State *)func[2],-1,
                 *(char **)((long)&stack0xffffffffffffffd8 + (long)local_2c * 8));
    lua_pushcclosure((lua_State *)func[2],json_protect_conversion,1);
    lua_setfield((lua_State *)func[2],-2,
                 *(char **)((long)&stack0xffffffffffffffd8 + (long)local_2c * 8));
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

static int lua_cjson_safe_new(lua_State *l)
{
    const char *func[] = { "decode", "encode", NULL };
    int i;

    lua_cjson_new(l);

    /* Fix new() method */
    lua_pushcfunction(l, lua_cjson_safe_new);
    lua_setfield(l, -2, "new");

    for (i = 0; func[i]; i++) {
        lua_getfield(l, -1, func[i]);
        lua_pushcclosure(l, json_protect_conversion, 1);
        lua_setfield(l, -2, func[i]);
    }

    return 1;
}